

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

void gguf_set_val_f64(gguf_context *ctx,char *key,double val)

{
  string *in_RSI;
  double in_stack_ffffffffffffff98;
  allocator<char> *__args;
  vector<gguf_kv,_std::allocator<gguf_kv>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_39;
  char *in_stack_ffffffffffffffc8;
  gguf_context *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  __args = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             (allocator<char> *)in_stack_ffffffffffffffd0);
  gguf_check_reserved_keys<double>(in_RSI,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator(&local_39);
  gguf_remove_key(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::vector<gguf_kv,std::allocator<gguf_kv>>::emplace_back<char_const*&,double&>
            (in_stack_ffffffffffffffb0,(char **)__args,(double *)in_RSI);
  return;
}

Assistant:

void gguf_set_val_f64(struct gguf_context * ctx, const char * key, double val) {
    gguf_check_reserved_keys(key, val);
    gguf_remove_key(ctx, key);
    ctx->kv.emplace_back(key, val);
}